

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

uint32_t __thiscall Assimp::AMFImporter::XML_ReadNode_GetVal_AsU32(AMFImporter *this)

{
  uint uVar1;
  int iVar2;
  DeadlyImportError *pDVar3;
  undefined4 extraout_var;
  allocator<char> local_69;
  string local_68;
  undefined1 local_45;
  allocator<char> local_31;
  string local_30;
  AMFImporter *local_10;
  AMFImporter *this_local;
  
  local_10 = this;
  uVar1 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((uVar1 & 1) == 0) {
    local_45 = 1;
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"XML_ReadNode_GetVal_AsU32. No data, seems file is corrupt.",
               &local_31);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_30);
    local_45 = 0;
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[3])();
  if (iVar2 != 3) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,
               "XML_ReadNode_GetVal_AsU32. Invalid type of XML element, seems file is corrupt.",
               &local_69);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_68);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
  }
  iVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xe])();
  uVar1 = strtoul10((char *)CONCAT44(extraout_var,iVar2),(char **)0x0);
  return uVar1;
}

Assistant:

uint32_t AMFImporter::XML_ReadNode_GetVal_AsU32()
{
	if(!mReader->read()) throw DeadlyImportError("XML_ReadNode_GetVal_AsU32. No data, seems file is corrupt.");
	if(mReader->getNodeType() != irr::io::EXN_TEXT) throw DeadlyImportError("XML_ReadNode_GetVal_AsU32. Invalid type of XML element, seems file is corrupt.");

	return strtoul10(mReader->getNodeData());
}